

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O3

void __thiscall spvtools::opt::BasicBlock::KillAllInsts(BasicBlock *this,bool killLabel)

{
  char cVar1;
  Instruction *pIVar2;
  Instruction *pIVar3;
  code *pcVar4;
  ulong *local_70;
  undefined8 local_68;
  code *local_60;
  code *local_58;
  Instruction *local_50;
  ulong local_48 [2];
  code *local_38;
  code *local_30;
  
  local_70 = local_48;
  local_48[1] = 0;
  local_48[0] = (ulong)killLabel;
  local_30 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.cpp:98:15)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.cpp:98:15)>
             ::_M_manager;
  local_68 = 0;
  local_58 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
             ::_M_manager;
  pIVar2 = (this->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if ((pIVar2 != (Instruction *)0x0) && ((killLabel || (pIVar2->opcode_ != OpLabel)))) {
    IRContext::KillInst(pIVar2->context_,pIVar2);
  }
  pIVar2 = (this->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  pcVar4 = std::
           _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
           ::_M_manager;
  if ((pIVar2 != (Instruction *)0x0) &&
     ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    do {
      if (pIVar2 == (Instruction *)0x0) break;
      pIVar3 = (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      local_50 = pIVar2;
      if (local_60 == (code *)0x0) {
        std::__throw_bad_function_call();
      }
      if ((pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar3 = (Instruction *)0x0;
      }
      cVar1 = (*local_58)(&local_70,&local_50);
      pIVar2 = pIVar3;
    } while (cVar1 != '\0');
    pcVar4 = local_60;
    if (local_60 == (code *)0x0) goto LAB_00567d1f;
  }
  (*pcVar4)(&local_70,&local_70,3);
LAB_00567d1f:
  if (local_38 != (code *)0x0) {
    (*local_38)(local_48,local_48,3);
  }
  return;
}

Assistant:

void BasicBlock::KillAllInsts(bool killLabel) {
  ForEachInst([killLabel](Instruction* ip) {
    if (killLabel || ip->opcode() != spv::Op::OpLabel) {
      ip->context()->KillInst(ip);
    }
  });
}